

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O0

int __thiscall QtMWidgets::PageControlPrivate::init(PageControlPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  QColor *pQVar3;
  QColor QVar4;
  QStyleOption local_50 [8];
  QStyleOption opt;
  QPalette local_28 [24];
  PageControlPrivate *local_10;
  PageControlPrivate *this_local;
  
  local_10 = this;
  QStyleOption::QStyleOption(local_50,1,0);
  QStyleOption::initFrom((QWidget *)local_50);
  pQVar3 = QPalette::color(local_28,Highlight);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->currentPageIndicatorColor).ct + 2) =
       *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->currentPageIndicatorColor = uVar1;
  QVar4 = lighterColor(&this->currentPageIndicatorColor,0x4b);
  *(long *)((long)&(this->pageIndicatorColor).ct + 2) = QVar4.ct._2_8_;
  *(long *)&this->pageIndicatorColor = QVar4._0_8_;
  iVar2 = FingerGeometry::width();
  this->radius = (int)(((double)iVar2 * 0.3) / 2.0);
  this->smallRadius = (int)((double)this->radius * 0.75);
  this->buttonSize = this->radius * 3;
  iVar2 = QStyleOption::~QStyleOption(local_50);
  return iVar2;
}

Assistant:

void
PageControlPrivate::init()
{
	QStyleOption opt;
	opt.initFrom( q );

	currentPageIndicatorColor = opt.palette.color( QPalette::Highlight );
	pageIndicatorColor = lighterColor( currentPageIndicatorColor, 75 );

	radius = FingerGeometry::width() * 0.3 / 2;

	smallRadius = radius * 0.75;

	buttonSize = radius * 3;
}